

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O1

int __thiscall pg::PSISolver::switch_strategy_seq(PSISolver *this,int pl)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  Game *pGVar4;
  ostream *poVar5;
  Error *this_00;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  _label_vertex local_70;
  int local_5c;
  long local_58;
  _label_vertex local_50;
  _label_vertex local_40;
  
  pGVar4 = (this->super_Solver).game;
  if (pGVar4->n_vertices < 1) {
    iVar6 = 0;
LAB_0015d1f0:
    if ((pl == 0) && (0 < ((this->super_Solver).game)->n_vertices)) {
      lVar15 = 0;
      do {
        lVar9 = halt;
        if (*(int *)(halt + lVar15 * 4) != 0) {
          bVar3 = si_val_less(this,-1,(int)lVar15);
          if (bVar3) {
            *(undefined4 *)(lVar9 + lVar15 * 4) = 0;
            if (1 < (this->super_Solver).trace) {
              poVar5 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"\x1b[1;37mno longer halt\x1b[m before vertex ",0x27);
              local_70.g = (this->super_Solver).game;
              local_70.v = (int)lVar15;
              poVar5 = operator<<(poVar5,&local_70);
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
            }
            iVar6 = iVar6 + 1;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < ((this->super_Solver).game)->n_vertices);
    }
    return iVar6;
  }
  uVar10 = 0;
  iVar6 = 0;
LAB_0015cd20:
  iVar2 = *(int *)(done + uVar10 * 4);
  if (iVar2 != 3) {
    if (iVar2 == 0) {
      this_00 = (Error *)__cxa_allocate_exception(0x40);
      Error::Error(this_00,"logic error",
                   "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/psi.cpp"
                   ,0x16c);
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    if ((uint)(((pGVar4->_owner)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) != pl)
    goto LAB_0015d1dc;
    uVar11 = pGVar4->_outedges[pGVar4->_firstouts[uVar10]];
    if (uVar11 != 0xffffffff) {
      piVar7 = pGVar4->_outedges + pGVar4->_firstouts[uVar10];
      uVar12 = *(uint *)(str + uVar10 * 4);
      bVar13 = 0;
      local_5c = iVar6;
LAB_0015cd92:
      uVar14 = (ulong)(int)uVar11;
      if (((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) &&
         (uVar11 != uVar12)) {
        local_58 = (long)(int)uVar12;
        if (pl == 0) {
          bVar3 = si_val_less(this,-(uint)(*(int *)(halt + local_58 * 4) != 0) | uVar12,
                              -(uint)(*(int *)(halt + uVar14 * 4) != 0) | uVar11);
          if (!bVar3) goto LAB_0015d1b0;
          if ((this->super_Solver).trace < 2) goto LAB_0015d19d;
          poVar5 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\x1b[1;37mupdate even strategy\x1b[m \x1b[1;33m",0x26);
          local_70.g = (this->super_Solver).game;
          local_70.v = (int)uVar10;
          poVar5 = operator<<(poVar5,&local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m from \x1b[1;33m",0x10);
          local_40.g = (this->super_Solver).game;
          local_40.v = uVar12;
          poVar5 = operator<<(poVar5,&local_40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m (",5);
          lVar15 = (long)k;
          do {
            if (lVar15 < 1) {
              lVar9 = 0xffffffff;
              break;
            }
            lVar9 = lVar15 + -1;
            lVar1 = lVar15 * 4;
            lVar15 = lVar9;
          } while (*(int *)(val + -4 + (long)(int)(uVar12 * k) * 4 + lVar1) == 0);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar9);
          bVar3 = *(int *)(halt + local_58 * 4) != 0;
          pcVar8 = ")H";
          if (!bVar3) {
            pcVar8 = ")";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)bVar3 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," to \x1b[1;33m",0xb);
          local_50.g = (this->super_Solver).game;
          local_50.v = uVar11;
          poVar5 = operator<<(poVar5,&local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m (",5);
          lVar15 = (long)k;
          do {
            if (lVar15 < 1) goto LAB_0015d133;
            lVar9 = lVar15 + -1;
            lVar1 = lVar15 * 4;
            lVar15 = lVar9;
          } while (*(int *)(val + -4 + (long)(int)(k * uVar11) * 4 + lVar1) == 0);
          goto LAB_0015d138;
        }
        bVar3 = si_val_less(this,-(uint)(*(int *)(halt + uVar14 * 4) != 0) | uVar11,
                            -(uint)(*(int *)(halt + local_58 * 4) != 0) | uVar12);
        if (!bVar3) goto LAB_0015d1b0;
        if (1 < (this->super_Solver).trace) {
          poVar5 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\x1b[1;37mupdate odd strategy\x1b[m \x1b[1;33m",0x25);
          local_70.g = (this->super_Solver).game;
          local_70.v = (int)uVar10;
          poVar5 = operator<<(poVar5,&local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m from \x1b[1;33m",0x10);
          local_40.g = (this->super_Solver).game;
          local_40.v = uVar12;
          poVar5 = operator<<(poVar5,&local_40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m (",5);
          lVar15 = (long)k;
          do {
            if (lVar15 < 1) {
              lVar9 = 0xffffffff;
              break;
            }
            lVar9 = lVar15 + -1;
            lVar1 = lVar15 * 4;
            lVar15 = lVar9;
          } while (*(int *)(val + -4 + (long)(int)(uVar12 * k) * 4 + lVar1) == 0);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar9);
          bVar3 = *(int *)(halt + local_58 * 4) != 0;
          pcVar8 = ")H";
          if (!bVar3) {
            pcVar8 = ")";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)bVar3 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," to \x1b[1;33m",0xb);
          local_50.g = (this->super_Solver).game;
          local_50.v = uVar11;
          poVar5 = operator<<(poVar5,&local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m (",5);
          lVar15 = (long)k;
          do {
            if (lVar15 < 1) goto LAB_0015d133;
            lVar9 = lVar15 + -1;
            lVar1 = lVar15 * 4;
            lVar15 = lVar9;
          } while (*(int *)(val + -4 + (long)(int)(k * uVar11) * 4 + lVar1) == 0);
          goto LAB_0015d138;
        }
        goto LAB_0015d19d;
      }
      goto LAB_0015d1b0;
    }
    uVar11 = 0;
    goto LAB_0015d1da;
  }
  goto LAB_0015d1dc;
LAB_0015d133:
  lVar9 = 0xffffffff;
LAB_0015d138:
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar9);
  bVar3 = *(int *)(halt + uVar14 * 4) != 0;
  pcVar8 = ")H";
  if (!bVar3) {
    pcVar8 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)bVar3 + 1);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
LAB_0015d19d:
  *(uint *)(str + uVar10 * 4) = uVar11;
  bVar13 = 1;
  uVar12 = uVar11;
LAB_0015d1b0:
  uVar11 = piVar7[1];
  piVar7 = piVar7 + 1;
  if (uVar11 == 0xffffffff) goto code_r0x0015d1c5;
  goto LAB_0015cd92;
code_r0x0015d1c5:
  uVar11 = (uint)bVar13;
  iVar6 = local_5c;
LAB_0015d1da:
  iVar6 = iVar6 + uVar11;
LAB_0015d1dc:
  uVar10 = uVar10 + 1;
  pGVar4 = (this->super_Solver).game;
  if (pGVar4->n_vertices <= (long)uVar10) goto LAB_0015d1f0;
  goto LAB_0015cd20;
}

Assistant:

int
PSISolver::switch_strategy_seq(int pl)
{
    int res = 0;

    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 3) continue; // skip "disabled or won"
        if (done[n] == 0) LOGIC_ERROR; // expecting done==1 or done==2
        if (owner(n) != pl) continue; // only change strategy for vertices of player <pl>

        bool changed = false;
        int cur_strat = str[n];
        for (auto curedge = outs(n); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue; // skip strategy to disabled
            if (to == cur_strat) continue; // skip strategy to same
            if (pl == 0) {
                // improving for player Even
                if (si_val_less(halt[cur_strat] ? -1 : cur_strat, halt[to] ? -1 : to)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate even strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            } else {
                // improving for player Odd
                if (si_val_less(halt[to] ? -1 : to, halt[cur_strat] ? -1 : cur_strat)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate odd strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            }
        }
        if (changed) res++;
    }

    if (pl == 0) {
        for (int n=0; n<nodecount(); n++) {
            if (halt[n] and si_val_less(-1, n)) {
                halt[n] = 0; // stop halting
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[1;37mno longer halt\033[m before vertex " << label_vertex(n) << std::endl;
                }
#endif
                res++;
            }
        }
    }

    return res;
}